

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O0

int nn_node_unsubscribe(nn_trie_node **self,uint8_t *data,size_t size)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  nn_trie_node **ppnVar4;
  uint8_t *data_00;
  nn_trie_node **ppnVar5;
  void *pvVar6;
  nn_trie_node *pnVar7;
  size_t in_RDX;
  uint8_t *in_RSI;
  long *in_RDI;
  nn_trie_node *ch2;
  nn_trie_node *new_node;
  nn_trie_node **ch;
  int new_min;
  int index;
  int j;
  int i;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  byte bVar8;
  void *in_stack_ffffffffffffffa0;
  nn_trie_node *pnVar9;
  uint local_2c;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_4;
  
  if (in_RDX != 0) {
    uVar1 = nn_node_check_prefix((nn_trie_node *)*in_RDI,in_RSI,in_RDX);
    if (uVar1 != *(byte *)(*in_RDI + 5)) {
      return 0;
    }
    ppnVar4 = (nn_trie_node **)(in_RSI + (int)(uint)*(byte *)(*in_RDI + 5));
    data_00 = (uint8_t *)(in_RDX - *(byte *)(*in_RDI + 5));
    if (data_00 != (uint8_t *)0x0) {
      ppnVar5 = nn_node_next((nn_trie_node *)
                             CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),'\0');
      if (ppnVar5 == (nn_trie_node **)0x0) {
        return 0;
      }
      iVar3 = nn_node_unsubscribe(ppnVar4,data_00,
                                  CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      if (iVar3 == 0) {
        return 0;
      }
      if (*ppnVar5 != (nn_trie_node *)0x0) {
        return 1;
      }
      if (*(byte *)(*in_RDI + 4) < 9) {
        for (local_2c = 0;
            (local_2c != *(byte *)(*in_RDI + 4) &&
            (*(char *)(*in_RDI + 0x10 + (long)(int)local_2c) != *(char *)ppnVar4));
            local_2c = local_2c + 1) {
        }
        memmove((void *)(*in_RDI + 0x10 + (long)(int)local_2c),
                (void *)(*in_RDI + (long)(int)local_2c + 0x11),
                (long)(int)((*(byte *)(*in_RDI + 4) - local_2c) + -1));
        ppnVar4 = nn_node_child((nn_trie_node *)*in_RDI,local_2c);
        ppnVar5 = nn_node_child((nn_trie_node *)*in_RDI,local_2c + 1);
        memmove(ppnVar4,ppnVar5,(long)(int)((*(byte *)(*in_RDI + 4) - local_2c) + -1) << 3);
        *(char *)(*in_RDI + 4) = *(char *)(*in_RDI + 4) + -1;
        pvVar6 = nn_realloc(in_stack_ffffffffffffffa0,
                            CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
        *in_RDI = (long)pvVar6;
        if ((*(char *)(*in_RDI + 4) == '\0') &&
           (iVar3 = nn_node_has_subscribers((nn_trie_node *)*in_RDI), iVar3 == 0)) {
          nn_free((void *)0x1e4741);
          *in_RDI = 0;
          return 1;
        }
        pnVar7 = nn_node_compact((nn_trie_node *)
                                 CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
        *in_RDI = (long)pnVar7;
        return 1;
      }
      if (*(ushort *)(*in_RDI + 0x12) < 10) {
        pnVar7 = (nn_trie_node *)nn_alloc_(0x1e49e3);
        pnVar7->refcount = 0;
        pnVar7->prefix_len = *(uint8_t *)(*in_RDI + 5);
        memcpy(pnVar7->prefix,(void *)(*in_RDI + 6),(ulong)pnVar7->prefix_len);
        pnVar7->type = '\b';
        iVar3 = 0;
        for (iVar2 = 0;
            iVar2 != ((uint)*(byte *)(*in_RDI + 0x11) - (uint)*(byte *)(*in_RDI + 0x10)) + 1;
            iVar2 = iVar2 + 1) {
          ppnVar4 = nn_node_child((nn_trie_node *)*in_RDI,iVar2);
          pnVar9 = *ppnVar4;
          if (pnVar9 != (nn_trie_node *)0x0) {
            pnVar7->prefix[(long)iVar3 + 10] = (char)iVar2 + *(char *)(*in_RDI + 0x10);
            ppnVar4 = nn_node_child(pnVar7,iVar3);
            *ppnVar4 = pnVar9;
            iVar3 = iVar3 + 1;
          }
        }
        nn_free((void *)0x1e4afa);
        *in_RDI = (long)pnVar7;
        return 1;
      }
      if (*(char *)ppnVar4 == *(char *)(*in_RDI + 0x10)) {
        iVar3 = 0;
        while ((iVar3 != ((uint)*(byte *)(*in_RDI + 0x11) - (uint)*(byte *)(*in_RDI + 0x10)) + 1 &&
               (ppnVar4 = nn_node_child((nn_trie_node *)*in_RDI,iVar3),
               *ppnVar4 == (nn_trie_node *)0x0))) {
          iVar3 = iVar3 + 1;
        }
        iVar2 = iVar3 + (uint)*(byte *)(*in_RDI + 0x10);
        ppnVar4 = nn_node_child((nn_trie_node *)*in_RDI,0);
        ppnVar5 = nn_node_child((nn_trie_node *)*in_RDI,iVar3);
        memmove(ppnVar4,ppnVar5,(long)(int)(((uint)*(byte *)(*in_RDI + 0x11) - iVar2) + 1) << 3);
        *(char *)(*in_RDI + 0x10) = (char)iVar2;
        *(short *)(*in_RDI + 0x12) = *(short *)(*in_RDI + 0x12) + -1;
        pvVar6 = nn_realloc(in_stack_ffffffffffffffa0,
                            CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
        *in_RDI = (long)pvVar6;
        return 1;
      }
      if (*(char *)ppnVar4 == *(char *)(*in_RDI + 0x11)) {
        iVar3 = (uint)*(byte *)(*in_RDI + 0x11) - (uint)*(byte *)(*in_RDI + 0x10);
        while ((iVar3 != 0 &&
               (ppnVar4 = nn_node_child((nn_trie_node *)*in_RDI,iVar3),
               *ppnVar4 == (nn_trie_node *)0x0))) {
          iVar3 = iVar3 + -1;
        }
        *(char *)(*in_RDI + 0x11) = (char)iVar3 + *(char *)(*in_RDI + 0x10);
        *(short *)(*in_RDI + 0x12) = *(short *)(*in_RDI + 0x12) + -1;
        pvVar6 = nn_realloc(in_stack_ffffffffffffffa0,
                            CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
        *in_RDI = (long)pvVar6;
        return 1;
      }
      *(short *)(*in_RDI + 0x12) = *(short *)(*in_RDI + 0x12) + -1;
      return 1;
    }
  }
  bVar8 = 1;
  if (*in_RDI != 0) {
    iVar3 = nn_node_has_subscribers((nn_trie_node *)*in_RDI);
    bVar8 = iVar3 != 0 ^ 0xff;
  }
  if ((bVar8 & 1) == 0) {
    *(int *)*in_RDI = *(int *)*in_RDI + -1;
    if (*(int *)*in_RDI == 0) {
      if (*(char *)(*in_RDI + 4) == '\0') {
        nn_free((void *)0x1e4b90);
        *in_RDI = 0;
        local_4 = 1;
      }
      else {
        pnVar7 = nn_node_compact((nn_trie_node *)CONCAT17(bVar8,in_stack_ffffffffffffff98));
        *in_RDI = (long)pnVar7;
        local_4 = 1;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

static int nn_node_unsubscribe (struct nn_trie_node **self,
    const uint8_t *data, size_t size)
{
    int i;
    int j;
    int index;
    int new_min;
    struct nn_trie_node **ch;
    struct nn_trie_node *new_node;
    struct nn_trie_node *ch2;

    if (!size)
        goto found;

    /*  If prefix does not match the data, return. */
    if (nn_node_check_prefix (*self, data, size) != (*self)->prefix_len)
        return 0;

    /*  Skip the prefix. */
    data += (*self)->prefix_len;
    size -= (*self)->prefix_len;

    if (!size)
        goto found;

    /*  Move to the next node. */
    ch = nn_node_next (*self, *data);
    if (!ch)
        return 0; /*  TODO: This should be an error. */

    /*  Recursive traversal of the trie happens here. If the subscription
        wasn't really removed, nothing have changed in the trie and
        no additional pruning is needed. */
    if (nn_node_unsubscribe (ch, data + 1, size - 1) == 0)
        return 0;

    /*  Subscription removal is already done. Now we are going to compact
        the trie. However, if the following node remains in place, there's
        nothing to compact here. */
    if (*ch)
        return 1;

    /*  Sparse array. */
    if ((*self)->type < NN_TRIE_DENSE_TYPE) {

        /*  Get the indices of the removed child. */
        for (index = 0; index != (*self)->type; ++index)
            if ((*self)->u.sparse.children [index] == *data)
                break;
        assert (index != (*self)->type);

        /*  Remove the destroyed child from both lists of children. */
        memmove (
            (*self)->u.sparse.children + index,
            (*self)->u.sparse.children + index + 1,
            (*self)->type - index - 1);
        memmove (
            nn_node_child (*self, index),
            nn_node_child (*self, index + 1),
            ((*self)->type - index - 1) * sizeof (struct nn_trie_node*));
        --(*self)->type;
        *self = nn_realloc (*self, sizeof (struct nn_trie_node) +
            ((*self)->type * sizeof (struct nn_trie_node*)));
        assert (*self);
        
        /*  If there are no more children and no refcount, we can delete
            the node altogether. */
        if (!(*self)->type && !nn_node_has_subscribers (*self)) {
            nn_free (*self);
            *self = NULL;
            return 1;
        }

        /*  Try to merge the node with the following node. */
        *self = nn_node_compact (*self);

        return 1;
    }

    /*  Dense array. */

    /*  In this case the array stays dense. We have to adjust the limits of
        the array, if appropriate. */
    if ((*self)->u.dense.nbr > NN_TRIE_SPARSE_MAX + 1) {

        /*  If the removed item is the leftmost one, trim the array from
            the left side. */
        if (*data == (*self)->u.dense.min) {
             for (i = 0; i != (*self)->u.dense.max - (*self)->u.dense.min + 1;
                   ++i)
                 if (*nn_node_child (*self, i))
                     break;
             new_min = i + (*self)->u.dense.min;
             memmove (nn_node_child (*self, 0), nn_node_child (*self, i),
                 ((*self)->u.dense.max - new_min + 1) *
                 sizeof (struct nn_trie_node*));
             (*self)->u.dense.min = new_min;
             --(*self)->u.dense.nbr;
             *self = nn_realloc (*self, sizeof (struct nn_trie_node) +
                 ((*self)->u.dense.max - new_min + 1) *
                 sizeof (struct nn_trie_node*));
             assert (*self);
             return 1;
        }

        /*  If the removed item is the rightmost one, trim the array from
            the right side. */
        if (*data == (*self)->u.dense.max) {
             for (i = (*self)->u.dense.max - (*self)->u.dense.min; i != 0; --i)
                 if (*nn_node_child (*self, i))
                     break;
             (*self)->u.dense.max = i + (*self)->u.dense.min;
             --(*self)->u.dense.nbr;
             *self = nn_realloc (*self, sizeof (struct nn_trie_node) +
                 ((*self)->u.dense.max - (*self)->u.dense.min + 1) *
                 sizeof (struct nn_trie_node*));
             assert (*self);
             return 1;
        }

        /*  If the item is removed from the middle of the array, do nothing. */
        --(*self)->u.dense.nbr;
        return 1;
    }

    /*  Convert dense array into sparse array. */
    {
        new_node = nn_alloc (sizeof (struct nn_trie_node) +
            NN_TRIE_SPARSE_MAX * sizeof (struct nn_trie_node*), "trie node");
        assert (new_node);
        new_node->refcount = 0;
        new_node->prefix_len = (*self)->prefix_len;
        memcpy (new_node->prefix, (*self)->prefix, new_node->prefix_len);
        new_node->type = NN_TRIE_SPARSE_MAX;
        j = 0;
        for (i = 0; i != (*self)->u.dense.max - (*self)->u.dense.min + 1;
              ++i) {
            ch2 = *nn_node_child (*self, i);
            if (ch2) {
                new_node->u.sparse.children [j] = i + (*self)->u.dense.min;
                *nn_node_child (new_node, j) = ch2;
                ++j;
            }
        }
        assert (j == NN_TRIE_SPARSE_MAX);
        nn_free (*self);
        *self = new_node;
        return 1;
    }

found:

    /*  We are at the end of the subscription here. */

    /*  Subscription doesn't exist. */
    if (nn_slow (!*self || !nn_node_has_subscribers (*self)))
        return -EINVAL;

    /*  Subscription exists. Unsubscribe. */
    --(*self)->refcount;

    /*  If reference count has dropped to zero we can try to compact
        the node. */
    if (!(*self)->refcount) {

        /*  If there are no children, we can delete the node altogether. */
        if (!(*self)->type) {
            nn_free (*self);
            *self = NULL;
            return 1;
        }

        /*  Try to merge the node with the following node. */
        *self = nn_node_compact (*self);
        return 1;
    }

    return 0;
}